

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.h
# Opt level: O2

QString * __thiscall
QStringDecoder::decodeAsString
          (QString *__return_storage_ptr__,QStringDecoder *this,QByteArrayView in)

{
  Interface *pIVar1;
  DecoderFn p_Var2;
  char16_t *pcVar3;
  qsizetype size;
  QChar *pQVar4;
  Initialization extraout_EDX;
  char16_t *__length;
  
  pIVar1 = (this->super_QStringConverter).iface;
  if (pIVar1 == (Interface *)0x0) {
    (this->super_QStringConverter).state.invalidChars = 1;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    size = (*pIVar1->toUtf16Len)(in.m_size);
    QString::QString(__return_storage_ptr__,size,extraout_EDX);
    p_Var2 = ((this->super_QStringConverter).iface)->toUtf16;
    pQVar4 = QString::data(__return_storage_ptr__);
    pQVar4 = (*p_Var2)(pQVar4,in,&(this->super_QStringConverter).state);
    pcVar3 = (__return_storage_ptr__->d).ptr;
    __length = L"";
    if (pcVar3 != (char16_t *)0x0) {
      __length = pcVar3;
    }
    QString::truncate(__return_storage_ptr__,(char *)((long)pQVar4 - (long)__length >> 1),
                      (__off_t)__length);
  }
  return __return_storage_ptr__;
}

Assistant:

QString decodeAsString(QByteArrayView in)
    {
        if (!iface) {
            // ensure that hasError returns true
            state.invalidChars = 1;
            return {};
        }
        QString result(iface->toUtf16Len(in.size()), Qt::Uninitialized);
        const QChar *out = iface->toUtf16(result.data(), in, &state);
        result.truncate(out - result.constData());
        return result;
    }